

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O0

void round_shift_16bit_w16_avx2(__m256i *in,int size,int bit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  uint uVar4;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  undefined1 auVar5 [16];
  int i_1;
  int i;
  __m256i round;
  undefined4 local_188;
  undefined4 local_184;
  undefined1 local_158;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  if ((int)in_EDX < 0) {
    local_158 = (char)-in_EDX;
    uVar4 = 1 << (local_158 - 1U & 0x1f);
    auVar1 = vpinsrw_avx(ZEXT216((ushort)uVar4),uVar4 & 0xffff,1);
    auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,2);
    auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,3);
    auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,4);
    auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,5);
    auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,6);
    auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,7);
    auVar2 = vpinsrw_avx(ZEXT216((ushort)uVar4),uVar4 & 0xffff,1);
    auVar2 = vpinsrw_avx(auVar2,uVar4 & 0xffff,2);
    auVar2 = vpinsrw_avx(auVar2,uVar4 & 0xffff,3);
    auVar2 = vpinsrw_avx(auVar2,uVar4 & 0xffff,4);
    auVar2 = vpinsrw_avx(auVar2,uVar4 & 0xffff,5);
    auVar2 = vpinsrw_avx(auVar2,uVar4 & 0xffff,6);
    auVar2 = vpinsrw_avx(auVar2,uVar4 & 0xffff,7);
    auVar5 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    uStack_b0 = auVar5._0_8_;
    uStack_a8 = auVar5._8_8_;
    for (local_184 = 0; local_184 < in_ESI; local_184 = local_184 + 1) {
      auVar3._16_8_ = uStack_b0;
      auVar3._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar3._24_8_ = uStack_a8;
      auVar3 = vpaddsw_avx2(*(undefined1 (*) [32])(in_RDI + (long)local_184 * 0x20),auVar3);
      *(undefined1 (*) [32])(in_RDI + (long)local_184 * 0x20) = auVar3;
      auVar3 = vpsraw_avx2(*(undefined1 (*) [32])(in_RDI + (long)local_184 * 0x20),ZEXT416(-in_EDX))
      ;
      *(undefined1 (*) [32])(in_RDI + (long)local_184 * 0x20) = auVar3;
    }
  }
  else if (0 < (int)in_EDX) {
    for (local_188 = 0; local_188 < in_ESI; local_188 = local_188 + 1) {
      auVar3 = vpsllw_avx2(*(undefined1 (*) [32])(in_RDI + (long)local_188 * 0x20),ZEXT416(in_EDX));
      *(undefined1 (*) [32])(in_RDI + (long)local_188 * 0x20) = auVar3;
    }
  }
  return;
}

Assistant:

static inline void round_shift_16bit_w16_avx2(__m256i *in, int size, int bit) {
  if (bit < 0) {
    bit = -bit;
    __m256i round = _mm256_set1_epi16(1 << (bit - 1));
    for (int i = 0; i < size; ++i) {
      in[i] = _mm256_adds_epi16(in[i], round);
      in[i] = _mm256_srai_epi16(in[i], bit);
    }
  } else if (bit > 0) {
    for (int i = 0; i < size; ++i) {
      in[i] = _mm256_slli_epi16(in[i], bit);
    }
  }
}